

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O0

void __thiscall wabt::interp::Istream::EmitInternal<unsigned_int>(Istream *this,uint val)

{
  Offset offset;
  uint val_local;
  Istream *this_local;
  
  offset = end(this);
  EmitAt<unsigned_int>(this,offset,val);
  return;
}

Assistant:

void WABT_VECTORCALL Istream::EmitInternal(T val) {
  EmitAt(end(), val);
}